

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Pi<(moira::Mode)3,_4> wrapper)

{
  Syntax SVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  An an;
  An an_00;
  
  SVar1 = this->style->syntax;
  if (SVar1 < (MUSASHI|MOIRA_MIT)) {
    if ((0x15U >> (SVar1 & 0x1f) & 1) == 0) {
      an_00.raw._2_2_ = 0;
      an_00.raw._0_2_ = (wrapper.ea)->reg;
      operator<<(this,an_00);
      cVar3 = '@';
      lVar4 = 0;
      do {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar3;
        cVar3 = "@+"[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 2);
    }
    else {
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '(';
      an.raw._2_2_ = 0;
      an.raw._0_2_ = (wrapper.ea)->reg;
      operator<<(this,an);
      cVar3 = ')';
      lVar4 = 0;
      do {
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar3;
        cVar3 = "cmpm.b  (A%d)+, (A%d)+"[lVar4 + 0x15];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 2);
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Pi<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:
       case Syntax::GNU:

            *this << "(" << An{ea.reg} << ")+";
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *this << An{ea.reg} << "@+";
            break;
    }

    return *this;
}